

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

make_caster<std::vector<PerfectMatch>_> *
pybind11::detail::load_type<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>(handle *handle)

{
  type_caster<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_void> *in_RSI;
  make_caster<std::vector<PerfectMatch>_> *in_RDI;
  make_caster<std::vector<PerfectMatch>_> *conv;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar1;
  
  uVar1 = 0;
  type_caster<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_void>::type_caster
            ((type_caster<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_void> *)0x325a64
            );
  load_type<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,void>
            (in_RSI,(handle *)CONCAT17(uVar1,in_stack_ffffffffffffffe8));
  return in_RDI;
}

Assistant:

make_caster<T> load_type(const handle &handle) {
    make_caster<T> conv;
    load_type(conv, handle);
    return conv;
}